

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_actor.hpp
# Opt level: O3

void __thiscall
cpp_properties::
properties_actor<cpp_properties::properties_actor_traits<std::set<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_less_key,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_policy>_>
::~properties_actor(properties_actor<cpp_properties::properties_actor_traits<std::set<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_less_key,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_policy>_>
                    *this)

{
  if ((this->property).super_type.m_initialized == true) {
    std::
    _Rb_tree<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::tuple<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::tuple<std::__cxx11::string,std::__cxx11::string>>,less_key,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
              ((_Rb_tree<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::tuple<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::tuple<std::__cxx11::string,std::__cxx11::string>>,less_key,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
                *)this->properties,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(this->property).super_type.m_storage,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(this->property).super_type.m_storage.dummy_ + 0x20));
  }
  boost::optional_detail::
  optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~optional_base(&(this->property).super_type);
  return;
}

Assistant:

~properties_actor() {
    if (property) {
      emplacer_policy::emplace(properties, std::move(property->first), std::move(property->second));
    }
  }